

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool tinyusdz::ExtractVariants(Stage *stage,Dictionary *dict,string *err)

{
  pointer pPVar1;
  bool bVar2;
  string *in_R9;
  Prim *prim;
  pointer prim_00;
  bool bVar3;
  allocator local_59;
  Dictionary *local_58;
  string local_50;
  
  local_58 = dict;
  if (dict == (Dictionary *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar3 = false;
  }
  else {
    prim_00 = (stage->_root_nodes).
              super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
              super__Vector_impl_data._M_start;
    pPVar1 = (stage->_root_nodes).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      bVar3 = prim_00 == pPVar1;
      if (bVar3) {
        return bVar3;
      }
      ::std::__cxx11::string::string((string *)&local_50,"",&local_59);
      bVar2 = anon_unknown_160::ExtractVariantsRec(0,&local_50,prim_00,local_58,(uint32_t)err,in_R9)
      ;
      ::std::__cxx11::string::_M_dispose();
      prim_00 = prim_00 + 1;
    } while (bVar2);
  }
  return bVar3;
}

Assistant:

bool ExtractVariants(const Stage &stage, Dictionary *dict, std::string *err) {
  if (!dict) {
    if (err) {
      (*err) += "`dict` argument is nullptr.\n";
    }

    return false;
  }

  for (const auto &prim : stage.root_prims()) {
    if (!ExtractVariantsRec(/* depth */ 0, /* root path */ "", prim, (*dict),
                            /* max_depth */ 1024 * 1024, err)) {
      return false;
    }
  }

  return true;
}